

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

bool __thiscall presolve::HPresolve::isImpliedIntegral(HPresolve *this,HighsInt col)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  double *pdVar2;
  double dVar3;
  int row;
  int iVar4;
  pointer piVar5;
  pointer pdVar6;
  bool bVar7;
  bool bVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  long lVar10;
  vector<double,_std::allocator<double>_> *pvVar11;
  HighsLp *pHVar12;
  double *pdVar13;
  long lVar14;
  double *pdVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  HighsInt local_7c;
  
  lVar14 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
  pdVar13 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar14;
  pdVar15 = (double *)
            ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar14);
  if (lVar14 == -1) {
    pdVar13 = (double *)0x0;
    pdVar15 = (double *)0x0;
  }
  piVar5 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar7 = true;
  do {
    if ((int)lVar14 == -1) {
      if (bVar7) {
        lVar14 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[col];
        pdVar13 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar14;
        pdVar15 = (double *)
                  ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar14);
        if (lVar14 == -1) {
          pdVar13 = (double *)0x0;
          pdVar15 = (double *)0x0;
        }
        piVar5 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        while( true ) {
          bVar7 = (int)lVar14 == -1;
          if (bVar7) break;
          dVar16 = 1.0 / *pdVar13;
          bVar8 = rowCoefficientsIntegral(this,*(HighsInt *)pdVar15,dVar16);
          if (!bVar8) {
            return bVar7;
          }
          pHVar12 = this->model;
          local_7c = *(HighsInt *)pdVar15;
          lVar10 = (long)local_7c;
          pdVar6 = (pHVar12->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          dVar18 = pdVar6[lVar10];
          if (dVar18 < INFINITY) {
            dVar3 = *pdVar13;
            dVar17 = floor(ABS(dVar16) * dVar18 + this->primal_feastol);
            dVar18 = ABS(dVar18 - dVar17 * ABS(dVar3));
            pdVar2 = &(this->options->super_HighsOptionsStruct).small_matrix_value;
            if (*pdVar2 <= dVar18 && dVar18 != *pdVar2) {
              pdVar6[lVar10] = dVar17 * ABS(dVar3);
              markChangedRow(this,local_7c);
              pHVar12 = this->model;
              local_7c = *(HighsInt *)pdVar15;
              lVar10 = (long)local_7c;
            }
          }
          pdVar6 = (pHVar12->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          dVar18 = pdVar6[lVar10];
          if (-INFINITY < dVar18) {
            dVar3 = *pdVar13;
            dVar16 = ceil(ABS(dVar16) * dVar18 - this->primal_feastol);
            dVar18 = ABS(dVar18 - dVar16 * ABS(dVar3));
            pdVar2 = &(this->options->super_HighsOptionsStruct).small_matrix_value;
            if (*pdVar2 <= dVar18 && dVar18 != *pdVar2) {
              pdVar6[lVar10] = dVar16 * ABS(dVar3);
              markChangedRow(this,local_7c);
            }
          }
          lVar10 = (long)(int)lVar14;
          lVar14 = (long)piVar5[lVar10];
          pdVar15 = (double *)((long)pdVar15 + lVar14 * 4 + lVar10 * -4);
          pdVar13 = pdVar13 + (lVar14 - lVar10);
        }
      }
      else {
        bVar7 = false;
      }
      return bVar7;
    }
    row = *(int *)pdVar15;
    iVar4 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[row];
    if ((iVar4 < 2) ||
       ((this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[row] < iVar4)) {
LAB_002ffbe4:
      bVar7 = false;
    }
    else {
      dVar16 = (this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
      dVar18 = -dVar16;
      pvVar1 = &this->model->row_lower_;
      pvVar11 = &this->model->row_upper_;
      pdVar2 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + row;
      pvVar9 = pvVar1;
      if (*pdVar2 <= dVar18 && dVar18 != *pdVar2) {
        pvVar9 = pvVar11;
      }
      if (dVar16 < (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[row]) {
        pvVar11 = pvVar1;
      }
      dVar16 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[row];
      pdVar2 = (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start + row;
      if ((dVar16 == *pdVar2) && (!NAN(dVar16) && !NAN(*pdVar2))) {
        bVar7 = rowCoefficientsIntegral(this,row,1.0 / *pdVar13);
        if (bVar7) {
          return true;
        }
        goto LAB_002ffbe4;
      }
    }
    lVar10 = (long)(int)lVar14;
    lVar14 = (long)piVar5[lVar10];
    pdVar15 = (double *)((long)pdVar15 + lVar14 * 4 + lVar10 * -4);
    pdVar13 = pdVar13 + (lVar14 - lVar10);
  } while( true );
}

Assistant:

bool HPresolve::isImpliedIntegral(HighsInt col) {
  // check if the integer constraint on a variable is implied by the model
  assert(model->integrality_[col] == HighsVarType::kInteger);

  bool runDualDetection = true;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    // if not all other columns are integer, skip row and also do not try the
    // dual detection in the second loop as it must hold for all rows
    if (rowsize[nz.index()] < 2 ||
        rowsizeInteger[nz.index()] < rowsize[nz.index()]) {
      runDualDetection = false;
      continue;
    }

    double rowLower = isImpliedEquationAtUpper(nz.index())
                          ? model->row_upper_[nz.index()]
                          : model->row_lower_[nz.index()];

    double rowUpper = isImpliedEquationAtLower(nz.index())
                          ? model->row_lower_[nz.index()]
                          : model->row_upper_[nz.index()];

    if (rowUpper == rowLower) {
      // if there is an equation the dual detection does not need to be tried
      runDualDetection = false;
      double scale = 1.0 / nz.value();
      if (!rowCoefficientsIntegral(nz.index(), scale)) continue;

      if (fractionality(model->row_lower_[nz.index()] * scale) >
          primal_feastol) {
        // todo infeasible
      }

      return true;
    }
  }

  if (!runDualDetection) return false;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    double scale = 1.0 / nz.value();
    // if row coefficients are not integral, variable is not (implied) integral
    if (!rowCoefficientsIntegral(nz.index(), scale)) return false;
    if (model->row_upper_[nz.index()] != kHighsInf) {
      // right-hand side: scale, round down and unscale again
      double rUpper =
          std::abs(nz.value()) *
          std::floor(model->row_upper_[nz.index()] * std::abs(scale) +
                     primal_feastol);
      // check if modification is large enough
      if (std::abs(model->row_upper_[nz.index()] - rUpper) >
          options->small_matrix_value) {
        // update right-hand side and mark row as changed
        model->row_upper_[nz.index()] = rUpper;
        markChangedRow(nz.index());
      }
    }
    if (model->row_lower_[nz.index()] != -kHighsInf) {
      // left-hand side: scale, round up and unscale again
      double rLower =
          std::abs(nz.value()) *
          std::ceil(model->row_lower_[nz.index()] * std::abs(scale) -
                    primal_feastol);
      // check if modification is large enough
      if (std::abs(model->row_lower_[nz.index()] - rLower) >
          options->small_matrix_value) {
        // update left-hand side and mark row as changed
        model->row_lower_[nz.index()] = rLower;
        markChangedRow(nz.index());
      }
    }
  }

  return true;
}